

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O0

void anon_unknown.dwarf_6334f::compareMat(M44f *M,M44f *N)

{
  ostream *poVar1;
  float *pfVar2;
  void *pvVar3;
  Matrix44<float> *this;
  float extraout_XMM0_Da;
  int k;
  int j;
  M44f D;
  float eps;
  Matrix44<float> *in_stack_000000d8;
  ostream *in_stack_000000e0;
  int local_5c;
  int local_58;
  Matrix44<float> *in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe8;
  float fVar4;
  
  fVar4 = 0.0001;
  Imath_2_5::Matrix44<float>::operator-
            ((Matrix44<float> *)CONCAT44(0x38d1b717,in_stack_ffffffffffffffe8),
             in_stack_ffffffffffffffe0);
  local_58 = 0;
  do {
    if (3 < local_58) {
      return;
    }
    for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
      this = (Matrix44<float> *)&stack0xffffffffffffffac;
      Imath_2_5::Matrix44<float>::operator[](this,local_58);
      std::abs((int)this);
      if (fVar4 < extraout_XMM0_Da) {
        poVar1 = std::operator<<((ostream *)&std::cout,"unexpectedly diff ");
        pfVar2 = Imath_2_5::Matrix44<float>::operator[]
                           ((Matrix44<float> *)&stack0xffffffffffffffac,local_58);
        pvVar3 = (void *)std::ostream::operator<<(poVar1,pfVar2[local_5c]);
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        poVar1 = (ostream *)std::ostream::operator<<(&std::cout,local_58);
        poVar1 = std::operator<<(poVar1," ");
        pvVar3 = (void *)std::ostream::operator<<(poVar1,local_5c);
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cout,"M\n");
        poVar1 = Imath_2_5::operator<<(in_stack_000000e0,in_stack_000000d8);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cout,"N\n");
        poVar1 = Imath_2_5::operator<<(in_stack_000000e0,in_stack_000000d8);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cout,"D\n");
        poVar1 = Imath_2_5::operator<<(in_stack_000000e0,in_stack_000000d8);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testMiscMatrixAlgo.cpp"
                      ,0xd8,"void (anonymous namespace)::compareMat(M44f &, M44f &)");
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

void
compareMat(M44f& M, M44f& N)
{
    float eps = 0.0001;
    
    /// Verify that the entries in M and N do not
    // differ too much.

    M44f D (M - N);

    for (int j = 0; j < 4; ++j)
    {
        for (int k = 0; k < 4; ++k)
        {
            //cout << "diff="<<D[j][k] << endl;
            if (abs (D[j][k]) > eps)
            {
                cout << "unexpectedly diff "<<
                D[j][k] << endl;

                cout << j << " " << k << endl;

                cout << "M\n" << M << endl;
                cout << "N\n" << N << endl;
                cout << "D\n" << D << endl;

                assert (false);
            }
        }
    }
}